

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

bool pstore::json::is_valid(string *str)

{
  pointer pcVar1;
  span<const_char,__1L> local_d8;
  extent_type<_1L> local_c8 [2];
  parser<pstore::json::null_output> local_b8;
  
  parser<pstore::json::null_output>::parser(&local_b8,0);
  pcVar1 = (str->_M_dataplus)._M_p;
  pstore::gsl::details::extent_type<-1L>::extent_type(local_c8,str->_M_string_length);
  local_d8.storage_.super_extent_type<_1L>.size_ = local_c8[0].size_;
  local_d8.storage_.data_ = pcVar1;
  parser<pstore::json::null_output>::input<pstore::gsl::span<char_const,_1l>>(&local_b8,&local_d8);
  parser<pstore::json::null_output>::eof(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.string_._M_dataplus._M_p != &local_b8.string_.field_2) {
    operator_delete(local_b8.string_._M_dataplus._M_p,
                    local_b8.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
  ::~deque(&local_b8.stack_.c);
  if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       )local_b8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       )0x0) {
    operator_delete((void *)local_b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
                            ._M_head_impl,0x68);
  }
  return local_b8.error_._M_value == 0;
}

Assistant:

bool is_valid (std::string const & str) {
            pstore::json::parser<pstore::json::null_output> p;
            p.input (pstore::gsl::make_span (str));
            p.eof ();
            return !p.has_error ();
        }